

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
DecodeAddiGroupBranch_4(MCInst *MI,uint32_t insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  bool bVar1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar2;
  uint uVar3;
  int64_t iVar4;
  _Bool HasRs;
  uint32_t Imm;
  uint32_t Rt;
  uint32_t Rs;
  MCRegisterInfo *Decoder_local;
  uint64_t Address_local;
  uint32_t insn_local;
  MCInst *MI_local;
  
  RegNo = fieldFromInstruction(insn,0x15,5);
  RegNo_00 = fieldFromInstruction(insn,0x10,5);
  uVar2 = fieldFromInstruction(insn,0,0x10);
  iVar4 = SignExtend64((ulong)uVar2,0x10);
  bVar1 = false;
  if (RegNo < RegNo_00) {
    if ((RegNo == 0) || (RegNo_00 <= RegNo)) {
      MCInst_setOpcode(MI,0xc3);
    }
    else {
      MCInst_setOpcode(MI,0xc1);
      bVar1 = true;
    }
  }
  else {
    MCInst_setOpcode(MI,0x117);
    bVar1 = true;
  }
  if (bVar1) {
    uVar3 = getReg(Decoder,8,RegNo);
    MCOperand_CreateReg0(MI,uVar3);
  }
  uVar3 = getReg(Decoder,8,RegNo_00);
  MCOperand_CreateReg0(MI,uVar3);
  MCOperand_CreateImm0(MI,(ulong)(uint)((int)iVar4 << 2));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeAddiGroupBranch_4(MCInst *MI, uint32_t insn,
		uint64_t Address, MCRegisterInfo *Decoder)
{
	// If we are called then we can assume that MIPS32r6/MIPS64r6 is enabled
	// (otherwise we would have matched the ADDI instruction from the earlier
	// ISA's instead).
	//
	// We have:
	//    0b001000 sssss ttttt iiiiiiiiiiiiiiii
	//      BOVC if rs >= rt
	//      BEQZALC if rs == 0 && rt != 0
	//      BEQC if rs < rt && rs != 0

	uint32_t Rs = fieldFromInstruction(insn, 21, 5);
	uint32_t Rt = fieldFromInstruction(insn, 16, 5);
	uint32_t Imm = (uint32_t)SignExtend64(fieldFromInstruction(insn, 0, 16), 16) * 4;
	bool HasRs = false;

	if (Rs >= Rt) {
		MCInst_setOpcode(MI, Mips_BOVC);
		HasRs = true;
	} else if (Rs != 0 && Rs < Rt) {
		MCInst_setOpcode(MI, Mips_BEQC);
		HasRs = true;
	} else
		MCInst_setOpcode(MI, Mips_BEQZALC);

	if (HasRs)
		MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rs));

	MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rt));
	MCOperand_CreateImm0(MI, Imm);

	return MCDisassembler_Success;
}